

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_mem clCreateFromGLTexture
                 (cl_context context,cl_mem_flags flags,cl_GLenum target,cl_GLint miplevel,
                 cl_GLuint texture,cl_int *errcode_ret)

{
  CEnumNameMap *this;
  CTracker *pCVar1;
  bool bVar2;
  CLIntercept *this_00;
  cl_mem image;
  undefined4 in_register_00000014;
  time_point local_98;
  time_point local_90;
  string local_80;
  __int_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  cl_int localErrorCode;
  undefined4 uStack_4c;
  undefined1 local_40 [16];
  
  this_00 = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     ((g_pIntercept->m_Dispatch).clCreateFromGLTexture == (cl_api_clCreateFromGLTexture)0x0)) {
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x22;
    }
    return (cl_mem)0x0;
  }
  local_60 = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((g_pIntercept->m_Config).CallLogging == true) {
    this = &g_pIntercept->m_EnumNameMap;
    CEnumNameMap::name_mem_flags_abi_cxx11_(&local_80,this,flags);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_80._M_dataplus._M_p;
    CEnumNameMap::name_gl_abi_cxx11_((string *)&localErrorCode,this,target);
    CLIntercept::callLoggingEnter
              (this_00,"clCreateFromGLTexture",local_60,(cl_kernel)0x0,
               "context = %p, flags = %s (%llX), texture_target = %s (%d), miplevel = %d, texture = %d"
               ,context,local_58,flags,CONCAT44(uStack_4c,localErrorCode),
               CONCAT44(in_register_00000014,target),(ulong)(uint)miplevel,(ulong)texture);
    if ((undefined1 *)CONCAT44(uStack_4c,localErrorCode) != local_40) {
      operator_delete((undefined1 *)CONCAT44(uStack_4c,localErrorCode));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  localErrorCode = 0;
  if ((((this_00->m_Config).CallLogging == false) && ((this_00->m_Config).ErrorLogging == false)) &&
     ((this_00->m_Config).ErrorAssert == false)) {
    if ((errcode_ret != (cl_int *)0x0) || ((this_00->m_Config).NoErrors == false))
    goto LAB_00129829;
  }
  else if (errcode_ret != (cl_int *)0x0) goto LAB_00129829;
  errcode_ret = &localErrorCode;
LAB_00129829:
  if (((this_00->m_Config).HostPerformanceTiming == false) &&
     ((this_00->m_Config).ChromeCallLogging != true)) {
    local_98.__d.__r = (duration)0;
  }
  else {
    local_98.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  image = (*(this_00->m_Dispatch).clCreateFromGLTexture)
                    (context,flags,target,miplevel,texture,errcode_ret);
  if (((this_00->m_Config).HostPerformanceTiming == false) &&
     ((this_00->m_Config).ChromeCallLogging != true)) {
    local_90.__d.__r = (duration)0;
  }
  else {
    local_90.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this_00->m_Config).HostPerformanceTiming == true) &&
       (((this_00->m_Config).HostPerformanceTimingMinEnqueue <= local_60 &&
        (local_60 <= (this_00->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
      CLIntercept::updateHostTimingStats
                (this_00,"clCreateFromGLTexture",&local_80,local_98,local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
    }
  }
  if ((image != (cl_mem)0x0) &&
     ((((this_00->m_Config).DumpImagesBeforeEnqueue != false ||
       ((this_00->m_Config).DumpImagesAfterEnqueue != false)) ||
      ((this_00->m_Config).CaptureReplay == true)))) {
    CLIntercept::addImage(this_00,image);
  }
  bVar2 = (this_00->m_Config).ErrorLogging;
  if ((((bVar2 != false) || ((this_00->m_Config).ErrorAssert != false)) ||
      ((this_00->m_Config).NoErrors == true)) && (*errcode_ret != 0)) {
    if (bVar2 != false) {
      CLIntercept::logError(this_00,"clCreateFromGLTexture",*errcode_ret);
    }
    if ((this_00->m_Config).ErrorAssert == true) {
      raise(5);
    }
    if ((this_00->m_Config).NoErrors == true) {
      *errcode_ret = 0;
    }
  }
  if ((image != (cl_mem)0x0) && ((this_00->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar1 = &(this_00->m_ObjectTracker).m_MemObjects;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  CLIntercept::logCL_GLTextureDetails(this_00,image,target,miplevel,texture);
  if ((this_00->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this_00,"clCreateFromGLTexture",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0
               ,"returned %p",image);
  }
  if ((this_00->m_Config).ChromeCallLogging == true) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
    CLIntercept::chromeCallLoggingExit
              (this_00,"clCreateFromGLTexture",&local_80,false,0,local_98,local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  return image;
}

Assistant:

CL_API_ENTRY cl_mem CL_API_CALL CLIRN(clCreateFromGLTexture)(
    cl_context context,
    cl_mem_flags flags,
    cl_GLenum target,
    cl_GLint miplevel,
    cl_GLuint texture,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    // The cl_khr_gl_sharing APIs and especially clGetGLContextInfoKHR are a
    // special-case: they are extension functions but do not necessarily pass
    // a dispatchable object as their first argument and are implemented in
    // the ICD loader and called into via the ICD dispatch table.  This means
    // that we can install it into our core API dispatch table as well and
    // don't need to look it up per-platform.

    if( pIntercept && pIntercept->dispatch().clCreateFromGLTexture )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER(
            "context = %p, "
            "flags = %s (%llX), "
            "texture_target = %s (%d), "
            "miplevel = %d, "
            "texture = %d",
            context,
            pIntercept->enumName().name_mem_flags( flags ).c_str(),
            flags,
            pIntercept->enumName().name_gl( target ).c_str(),
            target,
            miplevel,
            texture );

        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_mem  retVal = pIntercept->dispatch().clCreateFromGLTexture(
            context,
            flags,
            target,
            miplevel,
            texture,
            errcode_ret);

        HOST_PERFORMANCE_TIMING_END();
        ADD_IMAGE( retVal );
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );

        pIntercept->logCL_GLTextureDetails( retVal, target, miplevel, texture );

        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}